

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

void CheckBlink(TidyDocImpl *doc,Node *node)

{
  char cVar1;
  Bool BVar2;
  ctmbstr ptVar3;
  ctmbstr cp;
  
  if ((((doc->access).PRIORITYCHK & 0xfffffffeU) == 2) &&
     (BVar2 = prvTidynodeIsText(node->content), BVar2 != no)) {
    ptVar3 = textFromOneNode(doc,node->content);
    do {
      cVar1 = *ptVar3;
      if (cVar1 == '\0') {
        return;
      }
      BVar2 = prvTidyIsWhite((int)cVar1);
      ptVar3 = ptVar3 + 1;
    } while (BVar2 != no);
    if (cVar1 != '\0') {
      prvTidyReportAccessError(doc,node,0x2e4);
      return;
    }
  }
  return;
}

Assistant:

static void CheckBlink( TidyDocImpl* doc, Node* node )
{
    
    if (Level2_Enabled( doc ))
    {
        /* Checks to see if text is found within the BLINK element. */
        if ( TY_(nodeIsText)(node->content) )
        {
            ctmbstr word = textFromOneNode( doc, node->content );
            if ( !IsWhitespace(word) )
            {
                TY_(ReportAccessError)( doc, node, REMOVE_BLINK_MARQUEE );
            }
        }
    }
}